

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stagewise_poly.cc
# Opt level: O1

base_learner * stagewise_poly_setup(options_i *options,vw *all)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  options_i *options_00;
  stagewise_poly *poly;
  long lVar4;
  option_group_definition *poVar5;
  typed_option<float> *ptVar6;
  typed_option<unsigned_int> *ptVar7;
  base_learner *l;
  single_learner *base;
  learner<stagewise_poly,_example> *plVar8;
  bool stage_poly;
  size_type __dnew_5;
  size_type __dnew_4;
  option_group_definition new_options;
  size_type __dnew;
  size_type __dnew_3;
  size_type __dnew_2;
  size_type __dnew_1;
  bool local_699;
  _func_int ***local_698;
  _func_int **local_690;
  _func_int **local_688 [2];
  options_i *local_678;
  long local_670;
  long *local_668;
  long local_660;
  long local_658 [2];
  _func_int ***local_648;
  _func_int **local_640;
  _func_int **local_638 [2];
  _func_int ***local_628;
  _func_int **local_620;
  _func_int **local_618 [2];
  string local_608;
  string local_5e8;
  string local_5c8;
  option_group_definition local_5a8;
  string local_570;
  _func_int ***local_550;
  _func_int **local_548;
  _func_int **local_540 [2];
  undefined1 local_530 [112];
  bool local_4c0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_4a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_498;
  undefined1 local_490 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_408;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3f8;
  typed_option<unsigned_int> local_3f0;
  typed_option<float> local_350;
  typed_option<bool> local_2b0;
  typed_option<unsigned_int> local_210;
  typed_option<float> local_170;
  typed_option<bool> local_d0;
  
  poly = calloc_or_throw<stagewise_poly>(1);
  memset(poly,0,0x6968);
  lVar4 = 0x80;
  do {
    puVar1 = (undefined8 *)
             ((long)(poly->synth_ec).super_example_predict.feature_space + lVar4 + -0x30);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)
             ((long)(poly->synth_ec).super_example_predict.feature_space + lVar4 + -0x40);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)
             ((long)(poly->synth_ec).super_example_predict.feature_space + lVar4 + -0x50);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)
             ((long)(poly->synth_ec).super_example_predict.feature_space + lVar4 + -0x60);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)
             ((long)(poly->synth_ec).super_example_predict.feature_space + lVar4 + -0x70);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)
             ((long)(poly->synth_ec).super_example_predict.feature_space + lVar4 + -0x80);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined4 *)((long)(poly->synth_ec).super_example_predict.feature_space + lVar4 + -0x20) = 0;
    lVar4 = lVar4 + 0x68;
  } while (lVar4 != 0x6880);
  (poly->synth_rec_f).x = 0.0;
  (poly->synth_rec_f).weight_index = 0;
  local_699 = false;
  local_530._0_8_ = (_func_int **)0x1c;
  local_698 = local_688;
  local_698 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_698,(ulong)local_530);
  local_688[0] = (_func_int **)local_530._0_8_;
  builtin_strncpy((char *)((long)local_698 + 0xc),"lynomial",8);
  builtin_strncpy((char *)((long)local_698 + 0x14)," options",8);
  *(undefined4 *)local_698 = 0x67617453;
  builtin_strncpy((char *)((long)local_698 + 4),"ewis",4);
  *(undefined4 *)(local_698 + 1) = 0x6f702065;
  builtin_strncpy((char *)((long)local_698 + 0xc),"lyno",4);
  local_690 = (_func_int **)local_530._0_8_;
  *(char *)((long)local_698 + local_530._0_8_) = '\0';
  local_5a8.m_name._M_dataplus._M_p = (pointer)&local_5a8.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_5a8,local_698,(char *)(local_530._0_8_ + (long)local_698));
  local_5a8.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_5a8.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_5a8.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_698 != local_688) {
    operator_delete(local_698);
  }
  local_5c8._M_dataplus._M_p = (pointer)&local_5c8.field_2;
  local_5c8.field_2._M_allocated_capacity = 0x6f705f6567617473;
  local_5c8.field_2._8_2_ = 0x796c;
  local_5c8._M_string_length = 10;
  local_5c8.field_2._M_local_buf[10] = '\0';
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_530,&local_5c8,&local_699);
  local_4c0 = true;
  local_628 = local_618;
  local_350.super_base_option._vptr_base_option = (_func_int **)0x29;
  local_628 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_628,(ulong)&local_350);
  local_618[0] = local_350.super_base_option._vptr_base_option;
  builtin_strncpy((char *)((long)local_628 + 0x19),"feature ",8);
  builtin_strncpy((char *)((long)local_628 + 0x21),"learning",8);
  local_628[2] = (_func_int **)0x6c61696d6f6e796c;
  local_628[3] = (_func_int **)0x6572757461656620;
  *local_628 = (_func_int **)0x6761747320657375;
  local_628[1] = (_func_int **)0x6f70206573697765;
  local_620 = local_350.super_base_option._vptr_base_option;
  *(char *)((long)local_628 + (long)local_350.super_base_option._vptr_base_option) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_530 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_d0,(typed_option<bool> *)local_530);
  poVar5 = VW::config::option_group_definition::add<bool>(&local_5a8,&local_d0);
  local_5e8._M_dataplus._M_p = (pointer)&local_5e8.field_2;
  local_5e8.field_2._M_allocated_capacity._0_6_ = 0x5f6465686373;
  local_5e8.field_2._M_allocated_capacity._6_2_ = 0x7865;
  local_5e8.field_2._8_6_ = 0x746e656e6f70;
  local_5e8._M_string_length = 0xe;
  local_5e8.field_2._M_local_buf[0xe] = '\0';
  VW::config::typed_option<float>::typed_option(&local_350,&local_5e8,&poly->sched_exponent);
  ptVar6 = VW::config::typed_option<float>::default_value(&local_350,1.0);
  local_648 = local_638;
  local_3f0.super_base_option._vptr_base_option = (_func_int **)0x32;
  local_648 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_648,(ulong)&local_3f0);
  local_638[0] = local_3f0.super_base_option._vptr_base_option;
  local_648[4] = (_func_int **)0x6564756c636e6920;
  local_648[5] = (_func_int **)0x7275746165662064;
  local_648[2] = (_func_int **)0x61757120676e696c;
  local_648[3] = (_func_int **)0x666f20797469746e;
  *local_648 = (_func_int **)0x746e656e6f707865;
  local_648[1] = (_func_int **)0x6c6f72746e6f6320;
  *(undefined2 *)(local_648 + 6) = 0x7365;
  local_640 = local_3f0.super_base_option._vptr_base_option;
  *(char *)((long)local_648 + (long)local_3f0.super_base_option._vptr_base_option) = '\0';
  std::__cxx11::string::_M_assign((string *)&(ptVar6->super_base_option).m_help);
  VW::config::typed_option<float>::typed_option(&local_170,ptVar6);
  local_678 = options;
  poVar5 = VW::config::option_group_definition::add<float>(poVar5,&local_170);
  local_608._M_dataplus._M_p = (pointer)&local_608.field_2;
  local_608.field_2._M_allocated_capacity = 0x7a735f6863746162;
  local_608._M_string_length = 8;
  local_608.field_2._M_local_buf[8] = '\0';
  VW::config::typed_option<unsigned_int>::typed_option(&local_3f0,&local_608,&poly->batch_sz);
  ptVar7 = VW::config::typed_option<unsigned_int>::default_value(&local_3f0,1000);
  local_490._0_8_ = (_func_int **)0x37;
  local_550 = local_540;
  local_550 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_550,(ulong)local_490);
  local_540[0] = (_func_int **)local_490._0_8_;
  local_550[4] = (_func_int **)0x6e6964756c636e69;
  local_550[5] = (_func_int **)0x662065726f6d2067;
  local_550[2] = (_func_int **)0x657a697320686374;
  local_550[3] = (_func_int **)0x2065726f66656220;
  *local_550 = (_func_int **)0x696c7069746c756d;
  local_550[1] = (_func_int **)0x6162206e6f207265;
  builtin_strncpy((char *)((long)local_550 + 0x2f),"features",8);
  local_548 = (_func_int **)local_490._0_8_;
  *(char *)((long)local_550 + local_490._0_8_) = '\0';
  std::__cxx11::string::_M_assign((string *)&(ptVar7->super_base_option).m_help);
  VW::config::typed_option<unsigned_int>::typed_option(&local_210,ptVar7);
  poVar5 = VW::config::option_group_definition::add<unsigned_int>(poVar5,&local_210);
  local_668 = (long *)0x14;
  local_570._M_dataplus._M_p = (pointer)&local_570.field_2;
  local_570._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_570,(ulong)&local_668);
  local_570.field_2._M_allocated_capacity = (size_type)local_668;
  builtin_strncpy(local_570._M_dataplus._M_p,"batch_sz_no_doubling",0x14);
  local_570._M_string_length = (size_type)local_668;
  local_570._M_dataplus._M_p[(long)local_668] = '\0';
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_490,&local_570,&poly->batch_sz_double);
  local_670 = 0x18;
  local_668 = local_658;
  local_668 = (long *)std::__cxx11::string::_M_create((ulong *)&local_668,(ulong)&local_670);
  local_658[0] = local_670;
  *local_668 = 0x7a735f6863746162;
  local_668[1] = 0x6f6e2073656f6420;
  local_668[2] = 0x656c62756f642074;
  local_660 = local_670;
  *(char *)((long)local_668 + local_670) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_490 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_2b0,(typed_option<bool> *)local_490);
  VW::config::option_group_definition::add<bool>(poVar5,&local_2b0);
  local_2b0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cd018;
  if (local_2b0.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b0.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_2b0.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b0.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_2b0.super_base_option);
  if (local_668 != local_658) {
    operator_delete(local_668);
  }
  local_490._0_8_ = &PTR__typed_option_002cd018;
  if (local_3f8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3f8._M_pi);
  }
  if (local_408._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_408._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_490);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_570._M_dataplus._M_p != &local_570.field_2) {
    operator_delete(local_570._M_dataplus._M_p);
  }
  local_210.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cd128;
  if (local_210.m_default_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_default_value.
               super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_210.m_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_210.super_base_option);
  if (local_550 != local_540) {
    operator_delete(local_550);
  }
  local_3f0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cd128;
  if (local_3f0.m_default_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3f0.m_default_value.
               super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_3f0.m_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3f0.m_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_3f0.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_608._M_dataplus._M_p != &local_608.field_2) {
    operator_delete(local_608._M_dataplus._M_p);
  }
  options_00 = local_678;
  local_170.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cd160;
  if (local_170.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_170.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_170.super_base_option);
  if (local_648 != local_638) {
    operator_delete(local_648);
  }
  local_350.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cd160;
  if (local_350.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_350.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_350.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_350.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_350.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5e8._M_dataplus._M_p != &local_5e8.field_2) {
    operator_delete(local_5e8._M_dataplus._M_p);
  }
  local_d0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cd018;
  if (local_d0.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_d0.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_d0.super_base_option);
  if (local_628 != local_618) {
    operator_delete(local_628);
  }
  local_530._0_8_ = &PTR__typed_option_002cd018;
  if (local_498._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_498._M_pi);
  }
  if (local_4a8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_4a8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_530);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5c8._M_dataplus._M_p != &local_5c8.field_2) {
    operator_delete(local_5c8._M_dataplus._M_p);
  }
  (**options_00->_vptr_options_i)(options_00,&local_5a8);
  if (local_699 == false) {
    plVar8 = (learner<stagewise_poly,_example> *)0x0;
  }
  else {
    poly->all = all;
    depthsbits_create(poly);
    poly->sd = (sort_data *)0x0;
    poly->sd_len = 0;
    poly->batch_sz_double = (bool)(poly->batch_sz_double ^ 1);
    poly->sum_sparsity = 0;
    poly->sum_input_sparsity = 0;
    poly->num_examples = 0;
    poly->sum_sparsity_sync = 0;
    poly->sum_input_sparsity_sync = 0;
    poly->num_examples_sync = 0;
    poly->last_example_counter = 0xffffffffffffffff;
    poly->numpasses = 1;
    poly->update_support = false;
    poly->original_ec = (example *)0x0;
    poly->next_batch_sz = poly->batch_sz;
    l = setup_base(options_00,all);
    base = LEARNER::as_singleline<char,char>(l);
    plVar8 = LEARNER::learner<stagewise_poly,example>::init_learner<LEARNER::learner<char,example>>
                       (poly,base,learn,predict,1,*(prediction_type_t *)(base + 0xd0));
    uVar2 = *(undefined8 *)(plVar8 + 0x18);
    uVar3 = *(undefined8 *)(plVar8 + 0x20);
    *(undefined8 *)(plVar8 + 0xb8) = uVar2;
    *(undefined8 *)(plVar8 + 0xc0) = uVar3;
    *(code **)(plVar8 + 200) = finish;
    *(code **)(plVar8 + 0x80) = save_load;
    *(undefined8 *)(plVar8 + 0x70) = uVar2;
    *(undefined8 *)(plVar8 + 0x78) = uVar3;
    *(undefined8 *)(plVar8 + 0x58) = uVar2;
    *(code **)(plVar8 + 0x68) = finish_example;
    *(undefined8 *)(plVar8 + 0x88) = uVar2;
    *(undefined8 *)(plVar8 + 0x90) = uVar3;
    *(code **)(plVar8 + 0x98) = end_pass;
    poly = (stagewise_poly *)0x0;
  }
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_5a8.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5a8.m_name._M_dataplus._M_p != &local_5a8.m_name.field_2) {
    operator_delete(local_5a8.m_name._M_dataplus._M_p);
  }
  if (poly != (stagewise_poly *)0x0) {
    free(poly);
  }
  return (base_learner *)plVar8;
}

Assistant:

base_learner *stagewise_poly_setup(options_i &options, vw &all)
{
  auto poly = scoped_calloc_or_throw<stagewise_poly>();
  bool stage_poly = false;
  option_group_definition new_options("Stagewise polynomial options");
  new_options.add(make_option("stage_poly", stage_poly).keep().help("use stagewise polynomial feature learning"))
      .add(make_option("sched_exponent", poly->sched_exponent)
               .default_value(1.f)
               .help("exponent controlling quantity of included features"))
      .add(make_option("batch_sz", poly->batch_sz)
               .default_value(1000)
               .help("multiplier on batch size before including more features"))
      .add(make_option("batch_sz_no_doubling", poly->batch_sz_double).help("batch_sz does not double"));
#ifdef MAGIC_ARGUMENT
  new_options.add(
      make_typed_option("magic_argument", poly->magic_argument).default_value(0.).help("magical feature flag"));
#endif  // MAGIC_ARGUMENT
  options.add_and_parse(new_options);

  if (!stage_poly)
    return nullptr;

  poly->all = &all;
  depthsbits_create(*poly.get());
  sort_data_create(*poly.get());

  poly->batch_sz_double = !poly->batch_sz_double;

  poly->sum_sparsity = 0;
  poly->sum_input_sparsity = 0;
  poly->num_examples = 0;
  poly->sum_sparsity_sync = 0;
  poly->sum_input_sparsity_sync = 0;
  poly->num_examples_sync = 0;
  poly->last_example_counter = -1;
  poly->numpasses = 1;
  poly->update_support = false;
  poly->original_ec = nullptr;
  poly->next_batch_sz = poly->batch_sz;

  learner<stagewise_poly, example> &l = init_learner(poly, as_singleline(setup_base(options, all)), learn, predict);
  l.set_finish(finish);
  l.set_save_load(save_load);
  l.set_finish_example(finish_example);
  l.set_end_pass(end_pass);

  return make_base(l);
}